

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_coefficients_to_phase_spectrum.cc
# Opt level: O3

bool __thiscall
sptk::FilterCoefficientsToPhaseSpectrum::Run
          (FilterCoefficientsToPhaseSpectrum *this,
          vector<double,_std::allocator<double>_> *numerator_coefficients,
          vector<double,_std::allocator<double>_> *denominator_coefficients,
          vector<double,_std::allocator<double>_> *phase_spectrum,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  size_t sVar13;
  long lVar14;
  size_type __new_size;
  pointer pdVar15;
  ulong uVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  if (this->is_valid_ == true) {
    iVar3 = this->num_numerator_order_;
    lVar17 = (long)(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    if (lVar17 == (long)iVar3 + 1) {
      if (buffer == (Buffer *)0x0) {
        return false;
      }
      if (phase_spectrum == (vector<double,_std::allocator<double>_> *)0x0) {
        return false;
      }
      lVar12 = (long)(denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>)
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>)
                     ._M_impl.super__Vector_impl_data._M_start;
      lVar14 = lVar12 >> 3;
      if (lVar14 != (long)this->num_denominator_order_ + 1) {
        return false;
      }
      iVar4 = this->fft_length_;
      uVar10 = iVar4 / 2 + 1;
      iVar11 = iVar4;
      if ((long)(phase_spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(phase_spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != (long)(int)uVar10) {
        std::vector<double,_std::allocator<double>_>::resize(phase_spectrum,(long)(int)uVar10);
        iVar11 = this->fft_length_;
      }
      this_00 = &buffer->real_part1_;
      __new_size = (size_type)iVar11;
      if ((long)(buffer->real_part1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->real_part1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
        __new_size = (size_type)this->fft_length_;
      }
      this_01 = &buffer->real_part2_;
      if ((long)(buffer->real_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->real_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(this_01,__new_size);
      }
      pdVar5 = (numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_start;
      pdVar15 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      sVar13 = (long)(numerator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pdVar5;
      if (sVar13 != 0) {
        memmove(pdVar15,pdVar5,sVar13);
        pdVar15 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
      pdVar5 = (buffer->real_part1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar15 + lVar17 != pdVar5) {
        memset(pdVar15 + lVar17,0,
               ((long)pdVar5 + (-0x10 - (long)(pdVar15 + iVar3)) & 0xfffffffffffffff8U) + 8);
      }
      pdVar5 = (denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pdVar15 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      sVar13 = (long)(denominator_coefficients->super__Vector_base<double,_std::allocator<double>_>)
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar5;
      if (sVar13 != 0) {
        memmove(pdVar15,pdVar5,sVar13);
        pdVar15 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
      pdVar5 = (buffer->real_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar15 + lVar14 != pdVar5) {
        memset(pdVar15 + lVar14,0,
               ((long)pdVar5 + (-8 - (lVar12 + (long)pdVar15)) & 0xfffffffffffffff8U) + 8);
      }
      bVar9 = RealValuedFastFourierTransform::Run
                        (&this->fast_fourier_transform_,this_00,&buffer->imag_part1_,
                         &buffer->buffer_for_fast_fourier_transform_);
      if (bVar9) {
        *(buffer->real_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start = 1.0;
        bVar9 = RealValuedFastFourierTransform::Run
                          (&this->fast_fourier_transform_,this_01,&buffer->imag_part2_,
                           &buffer->buffer_for_fast_fourier_transform_);
        if (bVar9) {
          if (iVar4 < -1) {
            return true;
          }
          pdVar5 = (phase_spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar15 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar6 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar7 = (buffer->imag_part1_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          pdVar8 = (buffer->imag_part2_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          dVar20 = 0.0;
          uVar16 = 0;
          do {
            dVar18 = pdVar7[uVar16];
            dVar19 = pdVar6[uVar16];
            dVar1 = pdVar15[uVar16];
            dVar2 = pdVar8[uVar16];
            dVar18 = atan2(dVar18 * dVar19 - dVar2 * dVar1,dVar1 * dVar19 + dVar18 * dVar2);
            dVar18 = dVar18 * 0.3183098861837907;
            pdVar5[uVar16] = dVar18;
            if ((uVar16 != 0) && (this->unwrapping_ != false)) {
              dVar19 = (dVar18 - pdVar5[uVar16 - 1]) + dVar20;
              if (dVar19 <= 1.0) {
                if (dVar19 < -1.0) {
                  dVar20 = dVar20 + 2.0;
                }
              }
              else {
                dVar20 = dVar20 + -2.0;
              }
              pdVar5[uVar16] = dVar18 + dVar20;
            }
            uVar16 = uVar16 + 1;
          } while (uVar10 != uVar16);
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool FilterCoefficientsToPhaseSpectrum::Run(
    const std::vector<double>& numerator_coefficients,
    const std::vector<double>& denominator_coefficients,
    std::vector<double>* phase_spectrum,
    FilterCoefficientsToPhaseSpectrum::Buffer* buffer) const {
  // Check inputs.
  const int numerator_length(num_numerator_order_ + 1);
  const int denominator_length(num_denominator_order_ + 1);
  if (!is_valid_ ||
      numerator_coefficients.size() !=
          static_cast<std::size_t>(numerator_length) ||
      denominator_coefficients.size() !=
          static_cast<std::size_t>(denominator_length) ||
      NULL == phase_spectrum || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int output_length(fft_length_ / 2 + 1);
  if (phase_spectrum->size() != static_cast<std::size_t>(output_length)) {
    phase_spectrum->resize(output_length);
  }
  if (buffer->real_part1_.size() != static_cast<std::size_t>(fft_length_)) {
    buffer->real_part1_.resize(fft_length_);
  }
  if (buffer->real_part2_.size() != static_cast<std::size_t>(fft_length_)) {
    buffer->real_part2_.resize(fft_length_);
  }

  std::copy(numerator_coefficients.begin(), numerator_coefficients.end(),
            buffer->real_part1_.begin());
  std::fill(buffer->real_part1_.begin() + numerator_length,
            buffer->real_part1_.end(), 0.0);
  std::copy(denominator_coefficients.begin(), denominator_coefficients.end(),
            buffer->real_part2_.begin());
  std::fill(buffer->real_part2_.begin() + denominator_length,
            buffer->real_part2_.end(), 0.0);

  if (!fast_fourier_transform_.Run(
          &buffer->real_part1_, &buffer->imag_part1_,
          &buffer->buffer_for_fast_fourier_transform_)) {
    return false;
  }

  buffer->real_part2_[0] = 1.0;
  if (!fast_fourier_transform_.Run(
          &buffer->real_part2_, &buffer->imag_part2_,
          &buffer->buffer_for_fast_fourier_transform_)) {
    return false;
  }

  double* output(&((*phase_spectrum)[0]));
  const double* xr(&buffer->real_part1_[0]);
  const double* yr(&buffer->real_part2_[0]);
  const double* xi(&buffer->imag_part1_[0]);
  const double* yi(&buffer->imag_part2_[0]);

  const double inverse_pi(1.0 / sptk::kPi);
  double offset(0.0);

  for (int i(0); i < output_length; ++i) {
    output[i] = inverse_pi * std::atan2(xi[i] * yr[i] - xr[i] * yi[i],
                                        xr[i] * yr[i] + xi[i] * yi[i]);
    if (unwrapping_ && 0 < i) {
      const double diff(output[i] - output[i - 1] + offset);
      if (1.0 < diff) {
        offset -= 2.0;
      } else if (1.0 < -diff) {
        offset += 2.0;
      }
      output[i] += offset;
    }
  }

  return true;
}